

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O3

Token __thiscall slang::parsing::Lexer::lexNumericLiteral(Lexer *this)

{
  byte *pbVar1;
  byte *pbVar2;
  undefined1 auVar3 [16];
  pointer plVar4;
  byte *pbVar5;
  undefined8 uVar6;
  char *pcVar7;
  int *piVar8;
  Diagnostic *this_00;
  byte bVar9;
  bool bVar10;
  uint uVar11;
  ulong uVar12;
  LiteralBase base;
  long lVar13;
  ulong in_R9;
  size_type sVar14;
  TokenKind TVar15;
  size_type sVar16;
  double dVar17;
  undefined1 auVar18 [16];
  Token TVar19;
  SVInt intVal;
  optional<slang::TimeUnit> timeSuffix;
  bool outOfRange;
  double value;
  SmallVector<char,_40UL> floatChars;
  SmallVector<slang::logic_t,_40UL> digits;
  byte local_f9;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_f8;
  uint local_f0;
  ushort local_ec;
  _Storage<slang::TimeUnit,_true> local_e4 [3];
  bool local_e1;
  undefined8 local_e0;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 local_d8;
  uint local_d0;
  byte local_cb;
  SmallVectorBase<char> local_c8 [2];
  long local_88;
  SmallVectorBase<slang::logic_t> local_80 [2];
  char *local_40;
  size_type sStack_38;
  undefined6 extraout_var;
  
  pbVar5 = (byte *)this->sourceBuffer;
  bVar9 = *pbVar5;
  if (bVar9 == 0x30) {
    do {
      pbVar5 = pbVar5 + 1;
      this->sourceBuffer = (char *)pbVar5;
      bVar9 = *pbVar5;
    } while (bVar9 == 0x30);
  }
  else if (bVar9 == 0x31) {
    lVar13 = 1;
    do {
      if (lVar13 == 5) {
        this->sourceBuffer = (char *)(pbVar5 + 5);
        TVar19 = create<>(this,OneStep);
        return TVar19;
      }
      pbVar1 = pbVar5 + lVar13;
      pbVar2 = (byte *)("1step" + lVar13);
      lVar13 = lVar13 + 1;
    } while (*pbVar1 == *pbVar2);
  }
  local_88 = (long)pbVar5 - (long)this->originalBegin;
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 0x28;
  local_c8[0].data_ = local_c8[0].firstElement;
  local_c8[0].len = 0;
  local_c8[0].cap = 0x28;
  do {
    sVar16 = local_80[0].len;
    plVar4 = local_80[0].data_;
    if (bVar9 != 0x5f) {
      if (9 < (byte)(bVar9 - 0x30)) goto LAB_002c3547;
      local_f8.val._0_1_ = bVar9 - 0x30;
      SmallVectorBase<slang::logic_t>::emplace_back<slang::logic_t>(local_80,(logic_t *)&local_f8);
      pbVar5 = (byte *)this->sourceBuffer;
    }
    this->sourceBuffer = (char *)(pbVar5 + 1);
    bVar9 = pbVar5[1];
    pbVar5 = pbVar5 + 1;
  } while( true );
LAB_002c3620:
  if (!bVar10) {
    local_f8.val._0_1_ = 0x30;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    pbVar5 = (byte *)this->sourceBuffer;
  }
  goto LAB_002c363b;
LAB_002c37ba:
  if (!(bool)(local_e0 == 0 & (bVar10 ^ 1U))) {
    this->sourceBuffer = pcVar7 + uVar12;
    if (!bVar10) {
      local_f8.val._0_1_ = 0x31;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    }
    TVar15 = Unknown;
    goto LAB_002c37f3;
  }
  local_c8[0].len = 0;
  goto LAB_002c386a;
LAB_002c3547:
  if (bVar9 == 0x2e) {
    this->sourceBuffer = (char *)(pbVar5 + 1);
    if (local_80[0].len == 0) {
      local_f8.val._0_1_ = 0x30;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    }
    else {
      sVar14 = 0;
      do {
        local_f8.val._0_1_ = *(char *)(plVar4 + sVar14) + '0';
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
        sVar14 = sVar14 + 1;
      } while (sVar16 != sVar14);
    }
    local_f8.val._0_1_ = 0x2e;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    pbVar5 = (byte *)this->sourceBuffer;
    bVar10 = false;
    do {
      bVar9 = *pbVar5;
      local_f8.val._0_1_ = bVar9;
      if (bVar9 != 0x5f) {
        if (9 < (byte)(bVar9 - 0x30)) goto LAB_002c3620;
        SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f8.val);
        pbVar5 = (byte *)this->sourceBuffer;
        bVar10 = true;
      }
      pbVar5 = pbVar5 + 1;
      this->sourceBuffer = (char *)pbVar5;
    } while( true );
  }
LAB_002c363b:
  sVar16 = local_80[0].len;
  plVar4 = local_80[0].data_;
  local_e4[1]._M_value = Seconds;
  local_f9 = *pbVar5;
  if ((local_f9 & 0xdf) == 0x45) {
    local_e0 = local_c8[0].len;
    if (local_c8[0].len == 0) {
      if (local_80[0].len == 0) {
        local_f8.val._0_1_ = 0x30;
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
      }
      else {
        sVar14 = 0;
        do {
          local_f8.val._0_1_ = *(char *)(plVar4 + sVar14) + '0';
          SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
          sVar14 = sVar14 + 1;
        } while (sVar16 != sVar14);
      }
    }
    local_f8.val._0_1_ = 0x65;
    SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    pcVar7 = this->sourceBuffer;
    local_f9 = pcVar7[1];
    if ((local_f9 == 0x2d) || (uVar11 = 1, local_f9 == 0x2b)) {
      SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f9);
      pcVar7 = this->sourceBuffer;
      local_f9 = pcVar7[2];
      uVar11 = 2;
    }
    uVar12 = (ulong)uVar11;
    bVar10 = false;
    do {
      if (local_f9 != 0x5f) {
        if (9 < (byte)(local_f9 - 0x30)) goto LAB_002c37ba;
        SmallVectorBase<char>::emplace_back<char_const&>(local_c8,(char *)&local_f9);
        pcVar7 = this->sourceBuffer;
        bVar10 = true;
      }
      local_f9 = pcVar7[uVar12 + 1];
      uVar12 = uVar12 + 1;
    } while( true );
  }
  local_e4._0_2_ = lexTimeLiteral(this);
  sVar16 = local_80[0].len;
  plVar4 = local_80[0].data_;
  uVar6 = CONCAT62(extraout_var,local_e4._0_2_);
  TVar15 = (TokenKind)((ulong)uVar6 >> 8);
  if (((uint)uVar6 >> 8 & 1) == 0) {
LAB_002c37f3:
    if (local_c8[0].len == 0) {
LAB_002c386a:
      sVar16 = local_80[0].len;
      local_f8.val = 0;
      local_f0 = 1;
      local_ec = 0;
      if (local_80[0].len != 0) {
        auVar18._8_4_ = (int)(local_80[0].len >> 0x20);
        auVar18._0_8_ = local_80[0].len;
        auVar18._12_4_ = 0x45300000;
        dVar17 = ceil(((auVar18._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)local_80[0].len) - 4503599627370496.0)) *
                      3.321928094887362);
        if (dVar17 <= 16777215.0) {
          base = (LiteralBase)(long)dVar17;
        }
        else {
          this_00 = Diagnostics::add(this->diagnostics,(DiagCode)0x30003,
                                     (SourceLocation)
                                     (local_88 << 0x1c | (ulong)((this->bufferId).id & 0xfffffff)));
          local_d8.val = 0xffffff;
          std::
          vector<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::pair<std::type_index,_std::any>_>_>_>
          ::emplace_back<long>(&this_00->args,(long *)&local_d8.val);
          base = ~Binary;
          sVar16 = local_80[0].len;
        }
        local_40 = (char *)local_80[0].data_;
        auVar3._8_8_ = 0;
        auVar3._0_8_ = in_R9;
        sStack_38 = sVar16;
        SVInt::fromDigits((bitwidth_t)&local_d8,base,true,false,
                          (span<const_slang::logic_t,_18446744073709551615UL>)(auVar3 << 0x40));
        SVInt::operator=((SVInt *)&local_f8,(SVInt *)&local_d8);
        if (((0x40 < local_d0) || ((local_cb & 1) != 0)) && ((void *)local_d8.val != (void *)0x0)) {
          operator_delete__(local_d8.pVal);
        }
        SVInt::shrinkToFit((SVInt *)&local_f8);
      }
      TVar19 = create<slang::SVInt&>(this,IntegerLiteral,(SVInt *)&local_f8);
      if (((0x40 < local_f0) || ((local_ec & 0x100) != 0)) && ((void *)local_f8.val != (void *)0x0))
      {
        operator_delete__(local_f8.pVal);
      }
      goto LAB_002c39c4;
    }
  }
  else if (local_c8[0].len == 0) {
    if (local_80[0].len == 0) {
      local_f8.val._0_1_ = 0x30;
      SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
    }
    else {
      local_e0 = CONCAT44(local_e0._4_4_,(int)((ulong)uVar6 >> 8)) & 0xffffffff00ffffff;
      sVar14 = 0;
      do {
        local_f8.val._0_1_ = *(char *)(plVar4 + sVar14) + '0';
        SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
        sVar14 = sVar14 + 1;
      } while (sVar16 != sVar14);
      TVar15 = (TokenKind)local_e0;
    }
    goto LAB_002c37f3;
  }
  local_f8.val = local_f8.val & 0xffffffffffffff00;
  SmallVectorBase<char>::emplace_back<char>(local_c8,(char *)&local_f8.val);
  piVar8 = __errno_location();
  *piVar8 = 0;
  local_d8 = (anon_union_8_2_628a4eb3_for_SVIntStorage_0)
             strtod(local_c8[0].data_,(char **)&local_f8.pVal);
  local_e1 = *piVar8 == 0x22;
  TVar19 = create<double&,bool&,std::optional<slang::TimeUnit>&>
                     (this,TVar15 & EndOfFile | RealLiteral,(double *)&local_d8,&local_e1,
                      (optional<slang::TimeUnit> *)local_e4);
LAB_002c39c4:
  if (local_c8[0].data_ != local_c8[0].firstElement) {
    operator_delete(local_c8[0].data_);
  }
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return TVar19;
}

Assistant:

Token Lexer::lexNumericLiteral() {
    // have to check for the "1step" magic keyword
    static const char OneStepText[] = "1step";
    for (int i = 0; i < (int)sizeof(OneStepText) - 1; i++) {
        if (peek(i) != OneStepText[i])
            break;
        if (i == sizeof(OneStepText) - 2) {
            advance(sizeof(OneStepText) - 1);
            return create(TokenKind::OneStep);
        }
    }

    // scan past leading zeros
    while (peek() == '0')
        advance();

    // Keep track of digits as we iterate through them; convert them
    // into logic_t to pass into the SVInt parsing method. If it turns out
    // that this is actually a float, we'll go back and populate `floatChars`
    // instead. Since we expect many more ints than floats, it makes sense to
    // not waste time populating that array up front.
    size_t startOfNum = currentOffset();
    SmallVector<logic_t> digits;
    SmallVector<char> floatChars;

    while (true) {
        char c = peek();
        if (c == '_')
            advance();
        else if (!isDecimalDigit(c))
            break;
        else {
            digits.push_back(logic_t(getDigitValue(c)));
            advance();
        }
    }

    auto populateChars = [&]() {
        if (digits.empty())
            floatChars.push_back('0');
        else {
            for (auto d : digits)
                floatChars.push_back(char((char)d.value + '0'));
        }
    };

    // Check for fractional digits.
    if (peek() == '.') {
        advance();
        populateChars();
        floatChars.push_back('.');

        bool any = false;
        while (true) {
            char c = peek();
            if (c == '_')
                advance();
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                advance();
            }
        }

        if (!any)
            floatChars.push_back('0');
    }

    // Check for an exponent. Note that this case can be indistinguishable from
    // the vector digits for a hex literal, so we can't issue any errors here if
    // we don't have a decimal point (from above).
    //
    // Consider this nasty case we need to support:
    // `FOO 3e+2
    // If `FOO is defined to be 'h this represents an expression: 62 + 2
    // Otherwise, this represents a real literal: 300.0

    std::optional<TimeUnit> timeSuffix;
    char c = peek();
    if (c == 'e' || c == 'E') {
        bool hasDecimal = !floatChars.empty();
        if (!hasDecimal)
            populateChars();

        floatChars.push_back('e');

        // skip over leading sign
        int index = 1;
        c = peek(index);
        if (c == '+' || c == '-') {
            floatChars.push_back(c);
            c = peek(++index);
        }

        bool any = false;
        while (true) {
            if (c == '_')
                c = peek(++index);
            else if (!isDecimalDigit(c))
                break;
            else {
                any = true;
                floatChars.push_back(c);
                c = peek(++index);
            }
        }

        if (any || hasDecimal) {
            advance(index);
            if (!any)
                floatChars.push_back('1');
        }
        else {
            // This isn't a float, it's probably a hex literal. Back up (by not calling advance)
            // and clear out the floatChars array so we don't think it should be a float.
            floatChars.clear();
        }
    }
    else {
        // Check for a time literal suffix directly adjacent. Time literal
        // values are always interpreted as doubles.
        timeSuffix = lexTimeLiteral();
        if (timeSuffix && floatChars.empty())
            populateChars();
    }

    if (!floatChars.empty()) {
        // We have a floating point result. Let the standard library do the heavy lifting of
        // converting and rounding correctly. Note that we depend on this code returning
        // 0 for underflow and +inf for overflow.
        floatChars.push_back('\0');

        char* end;
        errno = 0;
        double value = strtod(floatChars.data(), &end);
        SLANG_ASSERT(end == floatChars.end() - 1); // should never error

        // If we had an overflow or underflow, errno is now ERANGE. We can't warn here in case
        // this turns out to actually be a hex literal. Have the token carry this info so someone
        // can check it later if they care.
        bool outOfRange = errno == ERANGE;

        return create(timeSuffix ? TokenKind::TimeLiteral : TokenKind::RealLiteral, value,
                      outOfRange, timeSuffix);
    }

    // normal numeric literal
    SVInt intVal;
    if (!digits.empty()) {
        double bitsDbl = ceil(BitsPerDecimal * double(digits.size()));
        bitwidth_t bits;
        if (bitsDbl <= double(SVInt::MAX_BITS))
            bits = (bitwidth_t)bitsDbl;
        else {
            addDiag(diag::LiteralSizeTooLarge, startOfNum) << (int)SVInt::MAX_BITS;
            bits = SVInt::MAX_BITS;
        }

        intVal = SVInt::fromDigits(bits, LiteralBase::Decimal, false, false, digits);
        intVal.shrinkToFit();
    }

    return create(TokenKind::IntegerLiteral, intVal);
}